

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::PropertyEnumStepEventLogEntry_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  uint32 uVar2;
  PropertyEnumStepEventLogEntry *pPVar3;
  PropertyEnumStepEventLogEntry *propertyEvt;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pPVar3 = GetInlineEventDataAs<TTD::NSLogEvents::PropertyEnumStepEventLogEntry,(TTD::NSLogEvents::EventKind)8>
                     (evt);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  pPVar3->ReturnCode = (uint)((byte)iVar1 & 1);
  uVar2 = FileReader::ReadUInt32(reader,propertyId,true);
  pPVar3->Pid = uVar2;
  uVar2 = FileReader::ReadUInt32(reader,attributeFlags,true);
  pPVar3->Attributes = (PropertyAttributes)uVar2;
  InitializeAsNullPtrTTString(&pPVar3->PropertyString);
  if (pPVar3->ReturnCode != 0) {
    FileReader::ReadString<TTD::SlabAllocatorBase<8>>
              (reader,stringVal,alloc,&pPVar3->PropertyString,true);
  }
  return;
}

Assistant:

void PropertyEnumStepEventLogEntry_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            PropertyEnumStepEventLogEntry* propertyEvt = GetInlineEventDataAs<PropertyEnumStepEventLogEntry, EventKind::PropertyEnumTag>(evt);

            propertyEvt->ReturnCode = reader->ReadBool(NSTokens::Key::boolVal, true);
            propertyEvt->Pid = (Js::PropertyId)reader->ReadUInt32(NSTokens::Key::propertyId, true);
            propertyEvt->Attributes = (Js::PropertyAttributes)reader->ReadUInt32(NSTokens::Key::attributeFlags, true);

            InitializeAsNullPtrTTString(propertyEvt->PropertyString);

            if(propertyEvt->ReturnCode)
            {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                reader->ReadString(NSTokens::Key::stringVal, alloc, propertyEvt->PropertyString, true);
#else
                if(propertyEvt->Pid == Js::Constants::NoProperty)
                {
                    reader->ReadString(NSTokens::Key::stringVal, alloc, propertyEvt->PropertyString, true);
                }
#endif
            }
        }